

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

void Abc_CollectTopOr(Abc_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vSuper_local;
  Abc_Obj_t *pObj_local;
  
  Vec_PtrClear(vSuper);
  iVar1 = Abc_ObjIsComplement(pObj);
  if (iVar1 == 0) {
    pAVar2 = Abc_ObjNot(pObj);
    Vec_PtrPush(vSuper,pAVar2);
  }
  else {
    pAVar2 = Abc_ObjNot(pObj);
    Abc_CollectTopOr_rec(pAVar2,vSuper);
    Vec_PtrUniqify(vSuper,Abc_ObjCompareById);
  }
  return;
}

Assistant:

void Abc_CollectTopOr( Abc_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    Vec_PtrClear( vSuper );
    if ( Abc_ObjIsComplement(pObj) )
    {
        Abc_CollectTopOr_rec( Abc_ObjNot(pObj), vSuper );
        Vec_PtrUniqify( vSuper, (int (*)())Abc_ObjCompareById );
    }
    else
        Vec_PtrPush( vSuper, Abc_ObjNot(pObj) );
}